

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rune.cc
# Opt level: O0

int duckdb_re2::utflen(char *s)

{
  int iVar1;
  byte *in_RDI;
  Rune rune;
  int n;
  int c;
  Rune local_14;
  int local_10;
  uint local_c;
  byte *local_8;
  
  local_10 = 0;
  local_8 = in_RDI;
  do {
    local_c = (uint)*local_8;
    if (local_c < 0x80) {
      if (local_c == 0) {
        return local_10;
      }
      local_8 = local_8 + 1;
    }
    else {
      iVar1 = chartorune(&local_14,(char *)local_8);
      local_8 = local_8 + iVar1;
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

int
utflen(const char *s)
{
	int c;
	int n;
	Rune rune;

	n = 0;
	for(;;) {
		c = *(unsigned char*)s;
		if(c < Runeself) {
			if(c == 0)
				return n;
			s++;
		} else
			s += chartorune(&rune, s);
		n++;
	}
	return 0;
}